

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O3

value * __thiscall
mjs::anon_unknown_35::decode_uri
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  char32_t cVar1;
  uint uVar2;
  conversion_result cVar3;
  wostream *pwVar4;
  wchar_t *pwVar5;
  uint uVar6;
  size_type __rlen;
  long lVar7;
  long lVar8;
  gc_heap_ptr<mjs::global_object> *pgVar9;
  undefined2 *puVar10;
  wchar_t *pwVar11;
  gc_heap_ptr<mjs::global_object> *pgVar12;
  undefined1 auVar13 [16];
  uint8_t buf [4];
  wstring res;
  wchar_t buf16 [2];
  wostringstream woss;
  wostringstream _woss;
  wchar_t *local_3b8;
  long local_3b0;
  long local_3a8 [2];
  gc_heap_ptr<mjs::global_object> *local_398;
  uchar local_38c;
  undefined2 local_38b;
  undefined1 local_389;
  wchar_t *local_388;
  ulong local_380;
  wchar_t local_378;
  undefined4 uStack_374;
  uint local_364;
  anon_unknown_35 *local_360;
  char32_t local_358;
  uint local_354;
  value *local_350;
  wchar_t *local_348;
  wchar_t *local_340;
  wchar_t *local_338;
  wstring_view local_330;
  gc_heap_ptr_untyped local_320 [23];
  wstring_view local_1a8 [23];
  
  pwVar5 = (wchar_t *)s._M_len;
  local_388 = &local_378;
  local_380 = 0;
  local_378 = L'\0';
  local_398 = global;
  if (global != (gc_heap_ptr<mjs::global_object> *)0x0) {
    pwVar11 = pwVar5 + 1;
    local_338 = pwVar5 + 3;
    pgVar9 = (gc_heap_ptr<mjs::global_object> *)0x0;
    local_360 = this;
    local_350 = __return_storage_ptr__;
    local_348 = pwVar11;
    local_340 = pwVar5;
    do {
      if (pwVar5[(long)pgVar9] == L'%') {
        pgVar12 = (gc_heap_ptr<mjs::global_object> *)
                  ((long)&(pgVar9->super_gc_heap_ptr_untyped).heap_ + 3);
        lVar7 = (long)local_398 - (long)pgVar12;
        if (local_398 < pgVar12) {
          anon_unknown_5::throw_uri_error((gc_heap_ptr<mjs::global_object> *)local_360);
        }
        uVar2 = get_hex_value2(pwVar11 + (long)pgVar9);
        local_38c = (uchar)uVar2;
        local_389 = 0;
        local_38b = 0;
        local_364 = 1;
        if ((char)local_38c < '\0') {
          uVar6 = 2;
          if ((((uVar2 & 0xe0) != 0xc0) && (uVar6 = 3, (uVar2 & 0xf0) != 0xe0)) &&
             (uVar6 = 4, (uVar2 & 0xf8) != 0xf0)) {
            std::__cxx11::wostringstream::wostringstream((wostringstream *)local_320);
            pwVar4 = std::operator<<((wostream *)local_320,"Unsupported: ");
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                      (pwVar4,pwVar5 + (long)pgVar12,lVar7);
            std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
            pwVar4 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
            std::__cxx11::wstringbuf::str();
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,local_3b8,local_3b0);
            if (local_3b8 != (wchar_t *)local_3a8) {
              operator_delete(local_3b8,local_3a8[0] * 4 + 4);
            }
            std::__cxx11::wstringbuf::str();
            throw_runtime_error(&local_330,
                                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                                ,0xe9);
          }
          pwVar11 = local_338 + (long)pgVar9;
          puVar10 = &local_38b;
          lVar7 = 0;
          local_364 = uVar6;
          do {
            lVar8 = lVar7;
            if (pwVar5[(long)&(pgVar9->super_gc_heap_ptr_untyped).heap_ + lVar8 + 3] != L'%') {
              std::__cxx11::wostringstream::wostringstream((wostringstream *)local_320);
              pwVar4 = std::operator<<((wostream *)local_320,"Unsupported: ");
              pgVar12 = (gc_heap_ptr<mjs::global_object> *)
                        ((long)&(pgVar9->super_gc_heap_ptr_untyped).heap_ + lVar8 + 3);
              if (pgVar12 <= local_398) {
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                          (pwVar4,pwVar11,(long)((long)local_398 + (-lVar8 - (long)pgVar9) + -3));
                std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
                pwVar4 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
                std::__cxx11::wstringbuf::str();
                std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,local_3b8,local_3b0)
                ;
                if (local_3b8 != (wchar_t *)local_3a8) {
                  operator_delete(local_3b8,local_3a8[0] * 4 + 4);
                }
                std::__cxx11::wstringbuf::str();
                throw_runtime_error(&local_330,
                                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                                    ,0xf0);
              }
              std::__throw_out_of_range_fmt
                        (anon_var_dwarf_1b750,"basic_string_view::substr",pgVar12,local_398);
LAB_0013ed57:
              anon_unknown_5::throw_uri_error((gc_heap_ptr<mjs::global_object> *)local_360);
            }
            if (local_398 <
                (gc_heap_ptr<mjs::global_object> *)
                ((long)&(pgVar9->super_gc_heap_ptr_untyped).heap_ + lVar8 + 6)) goto LAB_0013ed57;
            uVar2 = get_hex_value2(pwVar11 + 1);
            *(char *)puVar10 = (char)uVar2;
            puVar10 = (undefined2 *)((long)puVar10 + 1);
            pwVar11 = pwVar11 + 3;
            lVar7 = lVar8 + 3;
          } while ((ulong)uVar6 * 3 + -3 != lVar8 + 3);
          pgVar12 = (gc_heap_ptr<mjs::global_object> *)
                    ((long)&(pgVar9->super_gc_heap_ptr_untyped).heap_ + lVar8 + 6);
          pwVar5 = local_340;
          pwVar11 = local_348;
        }
        uVar2 = local_364;
        cVar3 = unicode::utf8_to_utf32<unsigned_char>(&local_38c,local_364);
        if (uVar2 != cVar3.length) {
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_320);
          pwVar4 = std::operator<<((wostream *)local_320,"Unsupported: ");
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,pwVar5,(long)local_398);
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
          pwVar4 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
          std::__cxx11::wstringbuf::str();
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,local_3b8,local_3b0);
          if (local_3b8 != (wchar_t *)local_3a8) {
            operator_delete(local_3b8,local_3a8[0] * 4 + 4);
          }
          std::__cxx11::wstringbuf::str();
          throw_runtime_error(&local_330,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                              ,0xf8);
        }
        cVar1 = cVar3.code_point;
        if (0x1a < (uint)cVar1 >> 0xb) {
          if ((uint)cVar1 >> 0xd < 7) {
LAB_0013eef2:
            std::__cxx11::wostringstream::wostringstream((wostringstream *)local_320);
            pwVar4 = std::operator<<((wostream *)local_320,"Unsupported: ");
            auVar13._8_8_ = (long)local_398 - (long)pgVar12;
            auVar13._0_8_ = pwVar4;
            if (local_398 < pgVar12) {
              auVar13 = std::__throw_out_of_range_fmt
                                  (anon_var_dwarf_1b750,"basic_string_view::substr",pgVar12,
                                   local_398);
            }
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                      (auVar13._0_8_,pwVar5 + (long)pgVar12,auVar13._8_8_);
            std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
            pwVar4 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
            std::__cxx11::wstringbuf::str();
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,local_3b8,local_3b0);
            if (local_3b8 != (wchar_t *)local_3a8) {
              operator_delete(local_3b8,local_3a8[0] * 4 + 4);
            }
            std::__cxx11::wstringbuf::str();
            throw_runtime_error(&local_330,
                                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                                ,0x100);
          }
          if ((ulong)cVar3 >> 0x30 != 0) {
            if (0x10 < cVar3.code_point._2_2_) goto LAB_0013eef2;
            local_354 = cVar1 & 0x3ffU | 0xdc00;
            cVar1 = (uint)(cVar1 + L'\xffff0000') >> 10 | 0xd800;
          }
        }
        local_358 = cVar1;
        std::__cxx11::wstring::replace((ulong)&local_388,local_380,(wchar_t *)0x0,(ulong)&local_358)
        ;
        pgVar9 = pgVar12;
      }
      else {
        std::__cxx11::wstring::push_back((wchar_t)&local_388);
        pgVar9 = (gc_heap_ptr<mjs::global_object> *)
                 ((long)&(pgVar9->super_gc_heap_ptr_untyped).heap_ + 1);
      }
      this = local_360;
      __return_storage_ptr__ = local_350;
    } while (pgVar9 < local_398);
  }
  local_1a8[0]._M_len = local_380;
  local_1a8[0]._M_str = local_388;
  string::string((string *)local_320,*(gc_heap **)this,local_1a8);
  __return_storage_ptr__->type_ = string;
  (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
  heap_ = local_320[0].heap_;
  *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_320[0].pos_;
  if (local_320[0].heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_320[0].heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_)
    ;
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(local_320);
  if (local_388 != &local_378) {
    operator_delete(local_388,CONCAT44(uStack_374,local_378) * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

value decode_uri(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wstring res;
    for (size_t i = 0; i < s.length();) {
        if (s[i] != '%') {
            res += s[i];
            ++i;
            continue;
        }
       auto get_byte = [&] () {
            assert(s[i] == '%');
            ++i;
            if (i + 2 > s.length()) {
                throw_uri_error(global);
            }
            i += 2;
            return static_cast<uint8_t>(get_hex_value2(&s[i-2]));
       };
       uint8_t buf[4] = { get_byte(), };
       const auto len = unicode::utf8_length_from_lead_code_unit(buf[0]);
       if (!len) {
           std::wostringstream woss;
           woss << "Unsupported: " << s.substr(i);
           NOT_IMPLEMENTED(woss.str());
       }
       assert(len <= sizeof(buf));
       for (unsigned j = 1; j < len; ++j) {
           if (s[i] != '%') {
               std::wostringstream woss;
               woss << "Unsupported: " << s.substr(i);
               NOT_IMPLEMENTED(woss.str());
           }
           buf[j] = get_byte();
       }
       auto conv = unicode::utf8_to_utf32(buf, len);
       if (conv.length != len) {
            std::wostringstream woss;
            woss << "Unsupported: " << s;
            NOT_IMPLEMENTED(woss.str());
        }
       wchar_t buf16[unicode::utf16_max_length];
       const auto len16 = unicode::utf32_to_utf16(conv.code_point, buf16);
       assert(len16 <= sizeof(buf16)/sizeof(*buf16));
       if (len16 == unicode::invalid_length) {
           std::wostringstream woss;
           woss << "Unsupported: " << s.substr(i);
           NOT_IMPLEMENTED(woss.str());
       }
       res.insert(res.end(), buf16, buf16 + len16);
    }
    return value{string{global.heap(), res}};
}